

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOICompactRewardDecPOMDPDiscrete::SetIndividualRewardModel
          (TOICompactRewardDecPOMDPDiscrete *this,RewardModel *rewardModel,Index agentID)

{
  pointer ppRVar1;
  
  ppRVar1 = (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->_m_p_rModels).
                    super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= (ulong)agentID) {
    std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::resize
              (&this->_m_p_rModels,(ulong)(agentID + 1));
    ppRVar1 = (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  ppRVar1[agentID] = rewardModel;
  return;
}

Assistant:

void TOICompactRewardDecPOMDPDiscrete::
SetIndividualRewardModel(RewardModel* rewardModel,
                         Index agentID)
{
    if(_m_p_rModels.size()<=agentID)
        _m_p_rModels.resize(agentID+1);

    _m_p_rModels[agentID]=rewardModel;
}